

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keno_HotAndCold.cpp
# Opt level: O2

void __thiscall
Keno_HotAndCold::infoHotAndCold
          (Keno_HotAndCold *this,vector<int,_std::allocator<int>_> *generate20Numbers)

{
  pointer piVar1;
  ulong uVar2;
  ulong uVar3;
  int i;
  ulong uVar4;
  int i_1;
  long lVar5;
  pair<int,_int> local_28;
  
  lVar5 = 0;
  for (uVar4 = 0;
      piVar1 = (generate20Numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(generate20Numbers->super__Vector_base<int,_std::allocator<int>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
      uVar4 = uVar4 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              (&saveGeneratedNumbers,(value_type_conflict2 *)((long)piVar1 + lVar5));
    lVar5 = lVar5 + 4;
  }
  uVar4 = 0;
  while( true ) {
    uVar2 = (long)saveGeneratedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)saveGeneratedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    if (uVar2 <= uVar4) break;
    for (uVar3 = 1; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      if (saveGeneratedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] ==
          saveGeneratedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3]) {
        count = count + 1;
      }
    }
    local_28.second = count;
    local_28.first =
         saveGeneratedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[uVar4];
    std::
    _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
    ::_M_emplace_equal<std::pair<int,int>>
              ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                *)&hot,&local_28);
    count = 0;
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void Keno_HotAndCold::infoHotAndCold(std::vector<int> &generate20Numbers) {
	int currNumber = 0;
	
	for (int i = 0; i < generate20Numbers.size(); ++i) {
		saveGeneratedNumbers.push_back(generate20Numbers[i]);
	}

	for (int i = 0; i < saveGeneratedNumbers.size(); ++i) {
		currNumber = saveGeneratedNumbers[i];
		for (int j = 1; j < saveGeneratedNumbers.size(); ++j) {
			if (saveGeneratedNumbers[i] == saveGeneratedNumbers[j]) {
				count++;
			}
		}
		hot.insert(std::pair<int, int>(currNumber, count));
		count = 0;
	}

	
	/*for (auto it = hot1.begin(); it != hot1.end(); ++it) {
		std::cout << it->first << " " << it->second << std::endl;
	}*/

	//int countHot = 0;
	//int number = 0;;
	//std::cout << "Hot Numbers: ";
	//for (auto it = hot.begin(); it != hot.end(); ++it) {
	//	
	//	for (auto it1 = it++; it1 != hot.end(); ++it1) {
	//		if (it->second < it1->second && it->first<=it1->first) { // count
	//			number = it1->first;
	//		}
	//		else {
	//			number = it -> first;
	//		}
	//	}
	//	printGeneratedNumbers.push_back(number);
	//}

	//int counter1 = 0;
	//for (size_t i = printGeneratedNumbers.size(); i >= 5 ; --i) {
	//	if (counter1 == 5) {
	//		break;
	//	}
	//	std::cout << printGeneratedNumbers[i] << " ";
	//}
	//count++;
	//std::cout << std::endl;
}